

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void computeJD(DateTime *p)

{
  int X2;
  int X1;
  int B;
  int A;
  int D;
  int M;
  int Y;
  DateTime *p_local;
  
  if (p->validJD == '\0') {
    if (p->validYMD == '\0') {
      D = 2000;
      A = 1;
      B = 1;
    }
    else {
      D = p->Y;
      A = p->M;
      B = p->D;
    }
    if (A < 3) {
      D = D + -1;
      A = A + 0xc;
    }
    p->iJD = (long)(((double)(((D + 0x126c) * 0x8ead) / 100 + ((A + 1) * 0x4ab51) / 10000 + B +
                             (2 - D / 100) + (D / 100) / 4) - 1524.5) * 86400000.0);
    p->validJD = '\x01';
    if ((p->validHMS != '\0') &&
       (p->iJD = (long)(p->h * 3600000 + p->m * 60000) + (long)(p->s * 1000.0) + p->iJD,
       p->validTZ != '\0')) {
      p->iJD = p->iJD - (long)(p->tz * 60000);
      p->validYMD = '\0';
      p->validHMS = '\0';
      p->validTZ = '\0';
    }
  }
  return;
}

Assistant:

static void computeJD(DateTime *p){
  int Y, M, D, A, B, X1, X2;

  if( p->validJD ) return;
  if( p->validYMD ){
    Y = p->Y;
    M = p->M;
    D = p->D;
  }else{
    Y = 2000;  /* If no YMD specified, assume 2000-Jan-01 */
    M = 1;
    D = 1;
  }
  if( M<=2 ){
    Y--;
    M += 12;
  }
  A = Y/100;
  B = 2 - A + (A/4);
  X1 = 36525*(Y+4716)/100;
  X2 = 306001*(M+1)/10000;
  p->iJD = (sqlite3_int64)((X1 + X2 + D + B - 1524.5 ) * 86400000);
  p->validJD = 1;
  if( p->validHMS ){
    p->iJD += p->h*3600000 + p->m*60000 + (sqlite3_int64)(p->s*1000);
    if( p->validTZ ){
      p->iJD -= p->tz*60000;
      p->validYMD = 0;
      p->validHMS = 0;
      p->validTZ = 0;
    }
  }
}